

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Kernel::MergeFrom(Kernel *this,Kernel *from)

{
  LogMessage *other;
  LinearKernel *this_00;
  PolyKernel *this_01;
  SigmoidKernel *this_02;
  RBFKernel *this_03;
  undefined1 *puVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/SVM.pb.cc"
               ,0x55b);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  switch(from->_oneof_case_[0]) {
  case 1:
    this_00 = _internal_mutable_linearkernel(this);
    if (from->_oneof_case_[0] == 1) {
      puVar1 = (undefined1 *)(from->kernel_).linearkernel_;
    }
    else {
      puVar1 = _LinearKernel_default_instance_;
    }
    LinearKernel::MergeFrom(this_00,(LinearKernel *)puVar1);
    break;
  case 2:
    this_03 = _internal_mutable_rbfkernel(this);
    if (from->_oneof_case_[0] == 2) {
      puVar1 = (undefined1 *)(from->kernel_).rbfkernel_;
    }
    else {
      puVar1 = _RBFKernel_default_instance_;
    }
    RBFKernel::MergeFrom(this_03,(RBFKernel *)puVar1);
    break;
  case 3:
    this_01 = _internal_mutable_polykernel(this);
    if (from->_oneof_case_[0] == 3) {
      puVar1 = (undefined1 *)(from->kernel_).polykernel_;
    }
    else {
      puVar1 = _PolyKernel_default_instance_;
    }
    PolyKernel::MergeFrom(this_01,(PolyKernel *)puVar1);
    break;
  case 4:
    this_02 = _internal_mutable_sigmoidkernel(this);
    if (from->_oneof_case_[0] == 4) {
      puVar1 = (undefined1 *)(from->kernel_).sigmoidkernel_;
    }
    else {
      puVar1 = _SigmoidKernel_default_instance_;
    }
    SigmoidKernel::MergeFrom(this_02,(SigmoidKernel *)puVar1);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Kernel::MergeFrom(const Kernel& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Kernel)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.kernel_case()) {
    case kLinearKernel: {
      _internal_mutable_linearkernel()->::CoreML::Specification::LinearKernel::MergeFrom(from._internal_linearkernel());
      break;
    }
    case kRbfKernel: {
      _internal_mutable_rbfkernel()->::CoreML::Specification::RBFKernel::MergeFrom(from._internal_rbfkernel());
      break;
    }
    case kPolyKernel: {
      _internal_mutable_polykernel()->::CoreML::Specification::PolyKernel::MergeFrom(from._internal_polykernel());
      break;
    }
    case kSigmoidKernel: {
      _internal_mutable_sigmoidkernel()->::CoreML::Specification::SigmoidKernel::MergeFrom(from._internal_sigmoidkernel());
      break;
    }
    case KERNEL_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}